

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key,
          SimpleDictionaryPropertyDescriptor<unsigned_short> **value,int *index)

{
  uint uVar1;
  
  uVar1 = FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>(this,key);
  if (-1 < (int)uVar1) {
    *value = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
             ((ulong)uVar1 * 0x18 + *(long *)(this + 8));
    *index = uVar1;
  }
  return -1 < (int)uVar1;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }